

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.cc
# Opt level: O2

void __thiscall
MemoryState::getChunk(MemoryState *this,uint1 *res,AddrSpace *spc,uintb off,int4 size)

{
  MemoryBank *this_00;
  LowlevelError *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if (((ulong)(long)spc->index < (ulong)(*(long *)(this + 0x10) - *(long *)(this + 8) >> 3)) &&
     (this_00 = *(MemoryBank **)(*(long *)(this + 8) + (long)spc->index * 8),
     this_00 != (MemoryBank *)0x0)) {
    MemoryBank::getChunk(this_00,off,size,res);
    return;
  }
  this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+(&bStack_38,"Getting chunk from unmapped memory space: ",&spc->name);
  LowlevelError::LowlevelError(this_01,&bStack_38);
  __cxa_throw(this_01,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void MemoryState::getChunk(uint1 *res,AddrSpace *spc,uintb off,int4 size) const

{
  MemoryBank *mspace = getMemoryBank(spc);
  if (mspace == (MemoryBank *)0)
    throw LowlevelError("Getting chunk from unmapped memory space: "+spc->getName());
  mspace->getChunk(off,size,res);
}